

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.cpp
# Opt level: O3

void __thiscall fp_remover::classes::Character::Character(Character *this)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  *(undefined4 *)&this->character_fp_start = 0xffffffff;
  *(undefined4 *)((long)&this->character_fp_start + 4) = 0xffffffff;
  *(undefined4 *)&this->character_fp_end = 0xffffffff;
  *(undefined4 *)((long)&this->character_fp_end + 4) = 0xffffffff;
  std::__cxx11::string::_M_replace((ulong)&this->name,0,(char *)0x0,0x107004);
  return;
}

Assistant:

Character::Character()
{
	character_fp_start = -1;
	character_fp_end = -1;
	name = "n/a";
}